

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_string.h
# Opt level: O0

size_t frozen::hash_string<std::basic_string_view<char,std::char_traits<char>>>
                 (basic_string_view<char,_std::char_traits<char>_> *value,size_t seed)

{
  const_iterator pvVar1;
  ulong in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  value_type *c;
  const_iterator __end1;
  const_iterator __begin1;
  basic_string_view<char,_std::char_traits<char>_> *__range2;
  size_t d;
  char *local_28;
  ulong local_18;
  
  local_18 = in_RSI ^ 0x811c9dc5;
  local_28 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::begin(in_RDI);
  pvVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::end(in_RDI);
  for (; local_18 = local_18 * 0x1000193, local_28 != pvVar1; local_28 = local_28 + 1) {
    local_18 = local_18 ^ (long)*local_28;
  }
  return local_18 >> 8;
}

Assistant:

constexpr std::size_t hash_string(const String& value, std::size_t seed) {
  std::size_t d =  (0x811c9dc5 ^ seed) * static_cast<size_t>(0x01000193);
  for (const auto& c : value)
    d = (d ^ static_cast<size_t>(c)) * static_cast<size_t>(0x01000193);
  return d >> 8 ;
}